

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O2

int pfx_table_create_node(trie_node **node,pfx_record *record)

{
  long lVar1;
  undefined4 *puVar2;
  undefined8 uVar3;
  int iVar4;
  trie_node *ptVar5;
  void *pvVar6;
  int iVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar5 = (trie_node *)lrtr_malloc(0x40);
  *node = ptVar5;
  iVar7 = -1;
  if (ptVar5 != (trie_node *)0x0) {
    (ptVar5->prefix).u.addr6.addr[3] = (record->prefix).u.addr6.addr[3];
    uVar3 = *(undefined8 *)((long)&(record->prefix).u + 4);
    *(undefined8 *)&ptVar5->prefix = *(undefined8 *)&record->prefix;
    *(undefined8 *)((long)&(ptVar5->prefix).u + 4) = uVar3;
    ptVar5 = *node;
    ptVar5->len = record->min_len;
    ptVar5->lchild = (trie_node *)0x0;
    (*node)->rchild = (trie_node *)0x0;
    (*node)->parent = (trie_node *)0x0;
    pvVar6 = lrtr_malloc(0x10);
    (*node)->data = pvVar6;
    ptVar5 = *node;
    puVar2 = (undefined4 *)ptVar5->data;
    if (puVar2 != (undefined4 *)0x0) {
      *puVar2 = 0;
      *(undefined8 *)(puVar2 + 2) = 0;
      iVar4 = pfx_table_append_elem((node_data *)(*node)->data,record);
      if (iVar4 == 0) {
        iVar7 = 0;
        goto LAB_0010774c;
      }
      lrtr_free((*node)->data);
      ptVar5 = *node;
    }
    lrtr_free(ptVar5);
  }
LAB_0010774c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

int pfx_table_create_node(struct trie_node **node, const struct pfx_record *record)
{
	int err;

	*node = lrtr_malloc(sizeof(struct trie_node));
	if (!*node)
		return PFX_ERROR;

	(*node)->prefix = record->prefix;
	(*node)->len = record->min_len;
	(*node)->lchild = NULL;
	(*node)->rchild = NULL;
	(*node)->parent = NULL;

	(*node)->data = lrtr_malloc(sizeof(struct node_data));
	if (!(*node)->data) {
		err = PFX_ERROR;
		goto free_node;
	}

	((struct node_data *)(*node)->data)->len = 0;
	((struct node_data *)(*node)->data)->ary = NULL;

	err = pfx_table_append_elem(((struct node_data *)(*node)->data), record);
	if (err)
		goto free_node_data;

	return PFX_SUCCESS;

free_node_data:
	lrtr_free((*node)->data);
free_node:
	lrtr_free(*node);

	return err;
}